

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O1

double units::convert<units::unit,units::unit>(double val,unit *start,unit *result)

{
  float fVar1;
  unit_data uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  uint uVar6;
  unit_data uVar7;
  unit *result_00;
  double dVar8;
  double dVar9;
  undefined8 extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  unit_data base_result;
  unit local_40;
  undefined1 local_38 [16];
  unit local_28;
  
  bVar5 = unit::operator==(start,result);
  if (bVar5) {
    return val;
  }
  uVar2 = start->base_units_;
  if (start->multiplier_ == 1.0 && uVar2 == (unit_data)0x30000000) {
    return val;
  }
  uVar7 = result->base_units_;
  if (result->multiplier_ == 1.0 && uVar7 == (unit_data)0x30000000) {
    return val;
  }
  dVar9 = (double)CONCAT44(in_XMM2_Db,in_XMM2_Da);
  if (((((uint)uVar2 | (uint)uVar7) >> 0x1e & 1) != 0) &&
     (dVar9 = (double)CONCAT44(in_XMM2_Db,in_XMM2_Da),
     (((uint)uVar7 ^ (uint)uVar2) & 0xfffffff) == 0)) {
    dVar9 = detail::convertFlaggedUnits<units::unit,units::unit>(val,start,result,NAN);
    in_XMM2_Dc = (undefined4)extraout_XMM0_Qb;
    in_XMM2_Dd = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
    if (!NAN(dVar9)) {
      return dVar9;
    }
  }
  uVar2 = start->base_units_;
  if (((int)uVar2 < 0) || (uVar7 = result->base_units_, (int)uVar7 < 0)) {
    if ((((uint)result->base_units_ ^ (uint)uVar2) & 0x307ffff) == 0) {
      local_40.multiplier_ = (float)uVar2;
      dVar9 = precise::equations::convert_equnit_to_value(val,(unit_data *)&local_40);
      local_40.multiplier_ = (float)result->base_units_;
      dVar9 = precise::equations::convert_value_to_equnit
                        ((dVar9 * (double)start->multiplier_) / (double)result->multiplier_,
                         (unit_data *)&local_40);
      return dVar9;
    }
LAB_003c406e:
    dVar9 = NAN;
  }
  else {
    if (uVar7 == uVar2) {
      fVar1 = start->multiplier_;
    }
    else {
      if ((((uint)uVar2 & (uint)uVar7) >> 0x1c & 1) == 0) {
        if ((((uint)uVar7 | (uint)uVar2) >> 0x1c & 1) != 0) {
          local_40 = *start;
          local_28 = *result;
          dVar9 = puconversion::assumedBase(&local_40,&local_28);
          if (!NAN(dVar9)) {
            dVar9 = convert<units::unit,units::unit>(val,start,result,dVar9);
            return dVar9;
          }
          goto LAB_003c406e;
        }
      }
      else {
        local_38._8_4_ = in_XMM2_Dc;
        local_38._0_8_ = dVar9;
        local_38._12_4_ = in_XMM2_Dd;
        local_40 = *start;
        bVar5 = unit::operator==(&local_40,(unit *)&pu);
        if (bVar5) {
          return val;
        }
        local_28 = *result;
        bVar5 = unit::operator==(&local_28,(unit *)&pu);
        if (bVar5) {
          return val;
        }
        local_40.multiplier_ = (float)start->base_units_;
        local_28.multiplier_ = (float)result->base_units_;
        dVar8 = puconversion::knownConversions(val,(unit_data *)&local_40,(unit_data *)&local_28);
        auVar10._0_8_ = -(ulong)NAN(dVar8) & local_38._0_8_;
        auVar10._8_8_ = extraout_XMM0_Qb_00 & local_38._8_8_;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = ~-(ulong)NAN(dVar8) & (ulong)dVar8;
        auVar10 = auVar10 | auVar3;
        dVar9 = auVar10._0_8_;
        in_XMM2_Dc = auVar10._8_4_;
        in_XMM2_Dd = auVar10._12_4_;
        if (!NAN(dVar8)) {
          return dVar9;
        }
      }
      uVar2 = start->base_units_;
      local_40.multiplier_ = (float)result->base_units_;
      uVar6 = (uint)result->base_units_ ^ (uint)uVar2;
      if ((uVar6 & 0xfffffff) != 0) {
        if ((uVar6 & 0x307ffff) == 0) {
          local_38._8_4_ = in_XMM2_Dc;
          local_38._0_8_ = dVar9;
          local_38._12_4_ = in_XMM2_Dd;
          dVar8 = detail::convertCountingUnits<units::unit,units::unit>(val,start,result);
          auVar11._0_8_ = -(ulong)NAN(dVar8) & local_38._0_8_;
          auVar11._8_8_ = extraout_XMM0_Qb_01 & local_38._8_8_;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = ~-(ulong)NAN(dVar8) & (ulong)dVar8;
          auVar11 = auVar11 | auVar4;
          dVar9 = auVar11._0_8_;
          in_XMM2_Dc = auVar11._8_4_;
          in_XMM2_Dd = auVar11._12_4_;
          if (!NAN(dVar8)) {
            return dVar9;
          }
        }
        local_38._8_4_ = in_XMM2_Dc;
        local_38._0_8_ = dVar9;
        local_38._12_4_ = in_XMM2_Dd;
        uVar7 = detail::unit_data::inv((unit_data *)&local_40);
        if ((((uint)uVar7 ^ (uint)uVar2) & 0xfffffff) != 0) {
          if (((((start->base_units_).field_0x3 & 0x40) != 0) ||
              (((result->base_units_).field_0x3 & 0x40) != 0)) &&
             (dVar9 = detail::extraValidConversions<units::unit,units::unit>
                                ((detail *)start,val,result,result_00), !NAN(dVar9))) {
            return (double)(-(ulong)NAN(dVar9) & local_38._0_8_ | ~-(ulong)NAN(dVar9) & (ulong)dVar9
                           );
          }
          dVar9 = detail::otherUsefulConversions<units::unit,units::unit>(val,start,result);
          return dVar9;
        }
        return 1.0 / ((double)result->multiplier_ * (double)start->multiplier_ * val);
      }
      fVar1 = start->multiplier_;
    }
    dVar9 = ((double)fVar1 * val) / (double)result->multiplier_;
  }
  return dVar9;
}

Assistant:

double convert(double val, const UX& start, const UX2& result)
{
    static_assert(
        std::is_same<UX, unit>::value || std::is_same<UX, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    static_assert(
        std::is_same<UX2, unit>::value ||
            std::is_same<UX2, precise_unit>::value,
        "convert argument types must be unit or precise_unit");
    if (start == result || is_default(start) || is_default(result)) {
        return val;
    }
    if ((start.has_e_flag() || result.has_e_flag()) &&
        start.has_same_base(result.base_units())) {
        double converted_val = detail::convertFlaggedUnits(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    if (start.is_equation() || result.is_equation()) {
        if (!start.base_units().equivalent_non_counting(result.base_units())) {
            return constants::invalid_conversion;
        }
        double keyval = precise::equations::convert_equnit_to_value(
            val, start.base_units());
        keyval = keyval * start.multiplier() / result.multiplier();
        return precise::equations::convert_value_to_equnit(
            keyval, result.base_units());
    }
    if (start.base_units() == result.base_units()) {
        return val * start.multiplier() / result.multiplier();
    }
    // check if both are pu since this doesn't require knowing a base unit
    if (start.is_per_unit() &&
        result.is_per_unit()) {  // we know they have different unit basis
        if (unit_cast(start) == pu || unit_cast(result) == pu) {
            // generic pu just means the units are equivalent since the other is
            // puXX already
            return val;
        }
        double converted_val = puconversion::knownConversions(
            val, start.base_units(), result.base_units());
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    } else if (start.is_per_unit() || result.is_per_unit()) {
        double genBase =
            puconversion::assumedBase(unit_cast(start), unit_cast(result));
        if (!std::isnan(genBase)) {
            return convert(val, start, result, genBase);
        }
        // other assumptions for PU base are probably dangerous so shouldn't be
        // allowed
        return constants::invalid_conversion;
    }

    auto base_start = start.base_units();
    auto base_result = result.base_units();
    if (base_start.has_same_base(base_result)) {
        // ignore i flag and e flag, special cases have been dealt with already,
        // so those are just markers
        return val * start.multiplier() / result.multiplier();
    }
    // deal with some counting conversions
    if (base_start.equivalent_non_counting(base_result)) {
        double converted_val = detail::convertCountingUnits(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    // check for inverse units
    if (base_start.has_same_base(base_result.inv())) {
        // ignore flag and e flag  special cases have been dealt with already,
        // so those are just markers
        return 1.0 / (val * start.multiplier() * result.multiplier());
    }
    if (start.has_e_flag() || result.has_e_flag()) {
        double converted_val =
            detail::extraValidConversions(val, start, result);
        if (!std::isnan(converted_val)) {
            return converted_val;
        }
    }
    // this is the last chance and will return invalid_result if it doesn't find
    // a match
    return detail::otherUsefulConversions(val, start, result);
}